

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLRParser.cpp
# Opt level: O2

void __thiscall GLRParser::GLRParser(GLRParser *this,CFG *cfg,bool verbose)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  pointer pbVar3;
  GLRParser *this_00;
  long lVar4;
  __type _Var5;
  bool bVar6;
  bool bVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar8;
  vector<Production_*,_std::allocator<Production_*>_> *__x;
  string *psVar9;
  Production *pPVar10;
  GLRState *pGVar11;
  Production *this_01;
  _Rb_tree_const_iterator<Production_*> _Var12;
  _Base_ptr p_Var13;
  _Rb_tree_node_base *p_Var14;
  _Rb_tree_node_base *p_Var15;
  GLRState *pGVar16;
  _Rb_tree_node_base *p_Var17;
  undefined8 uVar18;
  undefined8 extraout_RDX;
  Production *production;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  long lVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c;
  pointer pbVar20;
  ulong uVar21;
  byte bVar22;
  uint __n;
  _Self __tmp;
  pair<std::_Rb_tree_iterator<GLRState_*>,_bool> pVar23;
  undefined1 auVar24 [16];
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<Production_*> __l_01;
  initializer_list<Production_*> __l_02;
  allocator_type local_2e1;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_2e0;
  pointer local_2d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  prodToMarked;
  set<GLRState_*,_std::less<GLRState_*>,_std::allocator<GLRState_*>_> *__range2;
  string s;
  GLRState *newState;
  Production *start;
  undefined1 local_258 [32];
  _Rb_tree_node_base *local_238;
  size_t local_230;
  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> sMovedRightOfX;
  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> startClosure;
  string var;
  string startS;
  GLRState *closureY;
  vector<Production_*,_std::allocator<Production_*>_> productionsP;
  string oldStartState;
  string local_120;
  string local_100;
  string local_e0;
  _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
  local_c0;
  _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
  local_90;
  _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
  local_60;
  
  this->verbose = verbose;
  (this->nonTerminalsV)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->nonTerminalsV)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2e0 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               *)&this->nonTerminalsV;
  p_Var1 = &(this->nonTerminalsV)._M_t._M_impl.super__Rb_tree_header;
  (this->nonTerminalsV)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->nonTerminalsV)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->terminalsT)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->terminalsT)._M_t._M_impl.super__Rb_tree_header;
  (this->terminalsT)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->nonTerminalsV)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->acceptState = (GLRState *)0x0;
  (this->terminalsT)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->terminalsT)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->terminalsT)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->states)._M_t._M_impl.super__Rb_tree_header;
  (this->states)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->states)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->states)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->states)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->states)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  CFG::splitUpLongerTerminals(cfg);
  pvVar8 = CFG::getNonTerminalsV_abi_cxx11_(cfg);
  pbVar3 = (pvVar8->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar20 = (pvVar8->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; pbVar20 != pbVar3;
      pbVar20 = pbVar20 + 1) {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>(local_2e0,pbVar20);
  }
  pvVar8 = CFG::getTerminalsT_abi_cxx11_(cfg);
  pbVar3 = (pvVar8->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar20 = (pvVar8->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; pbVar20 != pbVar3;
      pbVar20 = pbVar20 + 1) {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->terminalsT,pbVar20);
  }
  __x = CFG::getProductionsP(cfg);
  std::vector<Production_*,_std::allocator<Production_*>_>::vector(&productionsP,__x);
  psVar9 = CFG::getStartS_abi_cxx11_(cfg);
  std::__cxx11::string::string((string *)&startS,(string *)psVar9);
  std::__cxx11::string::string((string *)&oldStartState,(string *)&startS);
  startStateName_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&startS,(string *)local_258);
  std::__cxx11::string::~string((string *)local_258);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>(local_2e0,&startS);
  pPVar10 = (Production *)operator_new(0x38);
  std::__cxx11::string::string((string *)local_258,(string *)&oldStartState);
  __l._M_len = 1;
  __l._M_array = (iterator)local_258;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&startClosure,__l,(allocator_type *)&prodToMarked);
  Production::Production
            (pPVar10,&startS,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&startClosure);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&startClosure);
  std::__cxx11::string::~string((string *)local_258);
  start = pPVar10;
  std::vector<Production_*,_std::allocator<Production_*>_>::push_back(&productionsP,&start);
  pGVar11 = (GLRState *)operator_new(0xb8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"accept",(allocator<char> *)&s);
  pPVar10 = (Production *)operator_new(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_258,"accept",(allocator<char> *)&var);
  std::__cxx11::string::string((string *)&startClosure,(string *)&startS);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&startClosure;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&prodToMarked,__l_00,(allocator_type *)&closureY);
  Production::Production(pPVar10,(string *)local_258,&prodToMarked);
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&sMovedRightOfX;
  sMovedRightOfX._M_t._M_impl._0_8_ = pPVar10;
  std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::set
            ((set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *)&local_90,
             __l_01,(less<Production_*> *)&newState,&local_2e1);
  GLRState::GLRState(pGVar11,&local_e0,
                     (set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *)
                     &local_90);
  this->acceptState = pGVar11;
  std::
  _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
  ::~_Rb_tree(&local_90);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&prodToMarked);
  std::__cxx11::string::~string((string *)&startClosure);
  std::__cxx11::string::~string((string *)local_258);
  std::__cxx11::string::~string((string *)&local_e0);
  p_Var17 = (_Rb_tree_node_base *)(local_258 + 8);
  local_258._0_8_ = (pointer)0x0;
  local_258._8_8_ = 0;
  local_258._16_8_ = 0;
  local_230 = 0;
  local_258._24_8_ = p_Var17;
  local_238 = p_Var17;
  while (productionsP.super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
         super__Vector_impl_data._M_start !=
         productionsP.super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
         super__Vector_impl_data._M_finish) {
    pPVar10 = *productionsP.super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_2d8 = productionsP.super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl
                .super__Vector_impl_data._M_start;
    pvVar8 = Production::getToP_abi_cxx11_(pPVar10);
    lVar19 = 0;
    for (uVar21 = 0;
        uVar21 <= (ulong)((long)(pvVar8->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pvVar8->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start >> 5);
        uVar21 = uVar21 + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&prodToMarked,pvVar8);
      pbVar20 = prodToMarked.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      getMarker_abi_cxx11_();
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_insert_rval(&prodToMarked,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&(pbVar20->_M_dataplus)._M_p + lVar19),(value_type *)&startClosure);
      std::__cxx11::string::~string((string *)&startClosure);
      this_01 = (Production *)operator_new(0x38);
      psVar9 = Production::getFromP_abi_cxx11_(pPVar10);
      Production::Production(this_01,psVar9,&prodToMarked);
      startClosure._M_t._M_impl._0_8_ = this_01;
      std::
      _Rb_tree<Production*,Production*,std::_Identity<Production*>,std::less<Production*>,std::allocator<Production*>>
      ::_M_insert_unique<Production*const&>
                ((_Rb_tree<Production*,Production*,std::_Identity<Production*>,std::less<Production*>,std::allocator<Production*>>
                  *)local_258,(Production **)&startClosure);
      psVar9 = Production::getFromP_abi_cxx11_(pPVar10);
      _Var5 = std::operator==(psVar9,&startS);
      if ((uVar21 == 0) && (_Var5)) {
        start = (Production *)startClosure._M_t._M_impl._0_8_;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&prodToMarked);
      lVar19 = lVar19 + 0x20;
    }
    productionsP.super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
    super__Vector_impl_data._M_start = local_2d8 + 1;
  }
  prodToMarked.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = &start->fromP;
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&prodToMarked;
  std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::set
            (&startClosure,__l_02,(less<Production_*> *)&sMovedRightOfX,(allocator_type *)&s);
  do {
    bVar6 = closure(this,&startClosure,
                    (set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *)
                    local_258);
  } while (bVar6);
  pGVar11 = (GLRState *)operator_new(0xb8);
  std::__cxx11::string::string((string *)&local_100,(string *)&startS);
  std::
  _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
  ::_Rb_tree(&local_c0,&startClosure._M_t);
  GLRState::GLRState(pGVar11,&local_100,
                     (set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *)
                     &local_c0);
  std::
  _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
  ::~_Rb_tree(&local_c0);
  std::__cxx11::string::~string((string *)&local_100);
  newState = pGVar11;
  pVar23 = std::
           _Rb_tree<GLRState*,GLRState*,std::_Identity<GLRState*>,std::less<GLRState*>,std::allocator<GLRState*>>
           ::_M_insert_unique<GLRState*const&>
                     ((_Rb_tree<GLRState*,GLRState*,std::_Identity<GLRState*>,std::less<GLRState*>,std::allocator<GLRState*>>
                       *)&this->states,&newState);
  uVar18 = pVar23._8_8_;
  this->startState = newState;
  local_2d8 = (pointer)CONCAT44(local_2d8._4_4_,2);
LAB_0011762f:
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  __n = 0;
  do {
LAB_0011764f:
    if ((this->states)._M_t._M_impl.super__Rb_tree_header._M_node_count <= (ulong)__n) {
      if (s._M_string_length != 0) {
        pGVar11 = (GLRState *)0x0;
        goto LAB_0011771d;
      }
      bVar6 = true;
      goto LAB_001179b7;
    }
    sMovedRightOfX._M_t._M_impl._0_8_ =
         (this->states)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::advance<std::_Rb_tree_const_iterator<GLRState*>,int>
              ((_Rb_tree_const_iterator<GLRState_*> *)&sMovedRightOfX,__n);
    pGVar11 = *(GLRState **)(sMovedRightOfX._M_t._M_impl._0_8_ + 0x20);
    if ((pGVar11->prodEstablished)._M_t._M_impl.super__Rb_tree_header._M_node_count <
        (pGVar11->productions)._M_t._M_impl.super__Rb_tree_header._M_node_count) break;
    __n = __n + 1;
    uVar18 = extraout_RDX;
  } while( true );
  p_Var13 = (pGVar11->productions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(pGVar11->prodEstablished)._M_t._M_impl.super__Rb_tree_header;
  while( true ) {
    _Var12 = std::
             __find_if<std::_Rb_tree_const_iterator<Production*>,__gnu_cxx::__ops::_Iter_equals_val<Production*const>>
                       ((pGVar11->prodEstablished)._M_t._M_impl.super__Rb_tree_header._M_header.
                        _M_left,p_Var2,p_Var13 + 1);
    if ((_Rb_tree_header *)_Var12._M_node == p_Var2) break;
    p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
  }
  this_00 = *(GLRParser **)(p_Var13 + 1);
  GLRState::increaseEstablished(pGVar11,(Production *)this_00);
  symbolAfterMarker_abi_cxx11_((string *)&prodToMarked,this_00,production);
  std::__cxx11::string::operator=((string *)&s,(string *)&prodToMarked);
  std::__cxx11::string::~string((string *)&prodToMarked);
  uVar18 = extraout_RDX_00;
  if (s._M_string_length == 0) goto LAB_0011764f;
LAB_0011771d:
  prodToMarked.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  prodToMarked.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var15 = (_Rb_tree_node_base *)
            &prodToMarked.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  auVar24._8_8_ = uVar18;
  auVar24._0_8_ = (pGVar11->productions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    p_Var14 = auVar24._0_8_;
    if ((_Rb_tree_header *)p_Var14 == &(pGVar11->productions)._M_t._M_impl.super__Rb_tree_header)
    break;
    var._M_dataplus._M_p = *(pointer *)(p_Var14 + 1);
    symbolAfterMarker_abi_cxx11_
              ((string *)&sMovedRightOfX,(GLRParser *)var._M_dataplus._M_p,auVar24._8_8_);
    _Var5 = std::operator==(&s,(string *)&sMovedRightOfX);
    std::__cxx11::string::~string((string *)&sMovedRightOfX);
    if (_Var5) {
      std::
      _Rb_tree<Production*,Production*,std::_Identity<Production*>,std::less<Production*>,std::allocator<Production*>>
      ::_M_insert_unique<Production*const&>
                ((_Rb_tree<Production*,Production*,std::_Identity<Production*>,std::less<Production*>,std::allocator<Production*>>
                  *)&prodToMarked,(Production **)&var);
    }
    auVar24 = std::_Rb_tree_increment(p_Var14);
  }
  sMovedRightOfX._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sMovedRightOfX._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sMovedRightOfX._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sMovedRightOfX._M_t._M_impl.super__Rb_tree_header._M_header;
  sMovedRightOfX._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sMovedRightOfX._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sMovedRightOfX._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (; p_Var15 !=
         (_Rb_tree_node_base *)
         &prodToMarked.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
      p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
    pPVar10 = *(Production **)(p_Var15 + 1);
    for (p_Var14 = (_Rb_tree_node_base *)local_258._24_8_; p_Var14 != p_Var17;
        p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14)) {
      var._M_dataplus._M_p = *(pointer *)(p_Var14 + 1);
      bVar6 = isMarkerMovedRight(pPVar10,(Production *)var._M_dataplus._M_p);
      if (bVar6) {
        std::
        _Rb_tree<Production*,Production*,std::_Identity<Production*>,std::less<Production*>,std::allocator<Production*>>
        ::_M_insert_unique<Production*const&>
                  ((_Rb_tree<Production*,Production*,std::_Identity<Production*>,std::less<Production*>,std::allocator<Production*>>
                    *)&sMovedRightOfX,(Production **)&var);
      }
    }
  }
  std::__cxx11::to_string((string *)&closureY,(int)local_2d8);
  std::operator+(&var,"STATE#",(string *)&closureY);
  std::__cxx11::string::~string((string *)&closureY);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>(local_2e0,&var);
  local_2d8 = (pointer)CONCAT44(local_2d8._4_4_,(int)local_2d8 + 1);
  do {
    bVar6 = closure(this,&sMovedRightOfX,
                    (set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *)
                    local_258);
  } while (bVar6);
  closureY = (GLRState *)0x0;
  bVar6 = false;
  for (p_Var13 = (this->states)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var13 != p_Var1; p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13)) {
    pGVar16 = *(GLRState **)(p_Var13 + 1);
    bVar7 = std::operator==(&(pGVar16->productions)._M_t,
                            (_Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
                             *)&sMovedRightOfX);
    if (bVar7) {
      std::__cxx11::string::_M_assign((string *)&var);
      bVar6 = true;
      closureY = pGVar16;
    }
  }
  if (!bVar6) {
    pGVar16 = (GLRState *)operator_new(0xb8);
    std::__cxx11::string::string((string *)&local_120,(string *)&var);
    std::
    _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
    ::_Rb_tree(&local_60,
               (_Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
                *)&sMovedRightOfX);
    GLRState::GLRState(pGVar16,&local_120,
                       (set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *)
                       &local_60);
    closureY = pGVar16;
    std::
    _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
    ::~_Rb_tree(&local_60);
    std::__cxx11::string::~string((string *)&local_120);
    std::
    _Rb_tree<GLRState*,GLRState*,std::_Identity<GLRState*>,std::less<GLRState*>,std::allocator<GLRState*>>
    ::_M_insert_unique<GLRState*const&>
              ((_Rb_tree<GLRState*,GLRState*,std::_Identity<GLRState*>,std::less<GLRState*>,std::allocator<GLRState*>>
                *)&this->states,&closureY);
  }
  GLRState::addStateTo(pGVar11,closureY,&s);
  std::__cxx11::string::~string((string *)&var);
  std::
  _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
  ::~_Rb_tree((_Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
               *)&sMovedRightOfX);
  std::
  _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
  ::~_Rb_tree((_Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
               *)&prodToMarked);
  bVar6 = false;
LAB_001179b7:
  std::__cxx11::string::~string((string *)&s);
  uVar18 = extraout_RDX_01;
  if (bVar6) {
    for (p_Var17 = (this->states)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var17 != p_Var1;
        p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17)) {
      lVar19 = *(long *)(p_Var17 + 1);
      bVar22 = 0;
      for (p_Var15 = *(_Rb_tree_node_base **)(lVar19 + 0x70);
          p_Var15 != (_Rb_tree_node_base *)(lVar19 + 0x60);
          p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
        pvVar8 = Production::getToP_abi_cxx11_(*(Production **)(p_Var15 + 1));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&sMovedRightOfX,pvVar8);
        lVar4 = CONCAT44(sMovedRightOfX._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                         sMovedRightOfX._M_t._M_impl.super__Rb_tree_header._M_header._M_color);
        if (sMovedRightOfX._M_t._M_impl._0_8_ != lVar4) {
          getMarker_abi_cxx11_();
          _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(lVar4 + -0x20),
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&prodToMarked);
          std::__cxx11::string::~string((string *)&prodToMarked);
          bVar22 = bVar22 | _Var5;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&sMovedRightOfX);
      }
      if (bVar22 != 0) {
        *(undefined1 *)(lVar19 + 0x20) = 1;
      }
    }
    std::
    _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
    ::~_Rb_tree(&startClosure._M_t);
    std::
    _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
    ::~_Rb_tree((_Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
                 *)local_258);
    std::__cxx11::string::~string((string *)&oldStartState);
    std::__cxx11::string::~string((string *)&startS);
    std::_Vector_base<Production_*,_std::allocator<Production_*>_>::~_Vector_base
              (&productionsP.super__Vector_base<Production_*,_std::allocator<Production_*>_>);
    return;
  }
  goto LAB_0011762f;
}

Assistant:

GLRParser::GLRParser(CFG *cfg, bool verbose) : verbose(verbose) {

    cfg->splitUpLongerTerminals();

    // Convert vector to set
    for (const auto &c: cfg->getNonTerminalsV()) {
        nonTerminalsV.insert(c);
    }
    for (const auto &c: cfg->getTerminalsT()) {
        terminalsT.insert(c);
    }

    // TODO: fix all terminals only 1 char
    std::vector<Production *> productionsP = cfg->getProductionsP();
    std::string startS = cfg->getStartS();

    int stateNr = 1;

    // Start by creating a new start state
    std::string oldStartState = startS;
    startS = startStateName();
    stateNr++;
    nonTerminalsV.insert(startS);
    // and letting this start state point to the original one
    auto *start = new Production(startS, {oldStartState});
    // (This ensures the start state appears in only one rewrite rule)
    productionsP.push_back(start);

    acceptState = new GLRState("accept", {new Production("accept", {startS})});

    // Introduce the marker ^ in all productions
    std::set<Production *> markedProductions = {};
    for (auto production: productionsP) {
        const std::vector<std::string> &prodTo = production->getToP();
        for (int i = 0; i <= prodTo.size(); ++i) { // TODO: Check whether <= doesn't give an overflow error
            std::vector<std::string> prodToMarked = prodTo;
            prodToMarked.insert(prodToMarked.begin() + i, getMarker());
            auto *markedProduction = new Production(production->getFromP(), prodToMarked);
            markedProductions.insert(markedProduction);
            if (production->getFromP() == startS && i == 0) {
                start = markedProduction;
            }
        }
    }


    // 1. Form the closure of the set containing the single marked rule S' -> ^S. Establish this set as the initial ste
    //     in the transition diastagram.
    // Start state is the new start
    std::set<Production *> startClosure = {start};
    while (closure(startClosure, markedProductions)) {}
    auto *newState = new GLRState(startS, startClosure);
    states.insert(newState);
    startState = newState;
//    std::set<Production *> establishedRulesInState = startClosure;
    // States is the vector containing all established states
//    std::set<Production *> processedProductions = {};


    // 2. While possible without redundancy do the following:
    while ("Possible without redundancy") { // Redundant once all productions are processed
        // a. Select a symbol s (terminal or nonterminal) appearing emmediately to the right of the marker in a rule in
        //     some established state A.
        std::string s;
        GLRState *stateA{};
        for (int i = 0; i < states.size(); ++i) {
            // Get the i-th element
            auto glrStateItr = states.begin();
            std::advance(glrStateItr, i);
            GLRState *glrState = *glrStateItr;

            if (glrState->getProductions().size() <= glrState->getProdEstablished().size()) {
                continue;
            }

//            std::cout << glrState->getName() << " has " << glrState->getProdEstablished().size() << " of " << glrState->getProductions().size()  << " productions established."<< std::endl;

            auto productionItr = glrState->getProductions().begin();
            Production *production;
            while (true) {
                // Check whether the current production is already established
                if (std::find(glrState->getProdEstablished().begin(), glrState->getProdEstablished().end(),
                              *productionItr) == glrState->getProdEstablished().end()) {
                    production = *productionItr;
                    glrState->increaseEstablished(production);
                    break;
                } else {
                    // TODO: fix stuck in Moved loop
//                    std::cerr << "Moved" << std::endl;
                    productionItr++;
                }
            }


            s = symbolAfterMarker(production);
            // Marker at end
            if (s.empty()) {
                i--;
                continue;
            }
            stateA = glrState;
            break;

        }
        if (s.empty()) {
//            std::cout << "No more found." << std::endl;
            break;
        }

        // b. Let X denote the collection of all marked rules in A that have s immediately to the right of their markers.
        std::set<Production *> sImmRightX;
        for (Production *production: stateA->getProductions()) {
            if (s == symbolAfterMarker(production)) {
                sImmRightX.insert(production);
            }
        }

        // c. Let Y be the set of marked rules obtained by moving the marker in each rule in X to the right of the symbol s.
        std::set<Production *> sMovedRightOfX;
        for (Production *production: sImmRightX) {
            for (Production *prod: markedProductions) {
                if (isMarkerMovedRight(production, prod)) {
                    sMovedRightOfX.insert(prod);
                }
            }
        }

        // d. If the closure of Y has not yet been established as a state, do so now.

        // Find a new name for the variable
//        char newVariable = 'A';
//        while (inVector(toString(newVariable), nonTerminalsV)) { newVariable++; }
        std::string var = "STATE#" + std::to_string(stateNr++);
        nonTerminalsV.insert(var);

        // Calculate the closure
        while (closure(sMovedRightOfX, markedProductions)) {}

        // Find another state with this closure
        GLRState *closureY{};
        bool stateExists = false;
        for (GLRState *s2: states) {
            if (s2->getProductions() == sMovedRightOfX) {
                var = s2->getName();
                stateExists = true;
                closureY = s2;
            }
        }

        if (!stateExists) {
            closureY = new GLRState(var, sMovedRightOfX);
            states.insert(closureY);
        }

        // e. Draw an arc labeled s from state A to closure of Y
        stateA->addStateTo(closureY, s);
//        std::string filename = "output/yeet" + var + ".dot";
//        toDot(filename);
    }

    // 3. Let each state represented by marked rules in terminal form be accept states in the automaton.
    for (auto state: states) {
        bool containsTerminalProduction = false; // TODO: check containsProduction or allProductions
        for (auto rule: state->getProductions()) {
            auto prodTo = rule->getToP();
            if (!prodTo.empty() && prodTo[prodTo.size() - 1] == getMarker()) {
                containsTerminalProduction = true;
            }
        }
        if (containsTerminalProduction) {
            state->setAccepting(true);
        }
    }

//    toDot("output/GLRParserTransitionScheme.dot");
//    buildTable();
//    printTable();
}